

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

Vec_Int_t * Aig_ManPartitionLevelized(Aig_Man_t *p,int nPartSize)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Vec_Vec_t *__ptr;
  Vec_Int_t *pVVar8;
  int *__s;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  __ptr = Aig_ManLevelize(p);
  iVar1 = p->vObjs->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar8->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar1;
  iVar13 = 0;
  memset(__s,0,(long)iVar1 << 2);
  iVar6 = __ptr->nSize;
  uVar9 = (ulong)iVar6;
  if (0 < (long)uVar9) {
    ppvVar3 = __ptr->pArray;
    uVar10 = uVar9;
    do {
      if (uVar9 < uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar4 = ppvVar3[uVar10 - 1];
      lVar11 = (long)*(int *)((long)pvVar4 + 4);
      iVar12 = iVar13;
      if (0 < lVar11) {
        iVar12 = iVar13 + *(int *)((long)pvVar4 + 4);
        do {
          if (*(int *)((long)pvVar4 + 4) < lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar2 = *(int *)(*(long *)(*(long *)((long)pvVar4 + 8) + -8 + lVar11 * 8) + 0x24);
          if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar7 = iVar13 / nPartSize;
          iVar13 = iVar13 + 1;
          __s[iVar2] = iVar7;
          lVar11 = lVar11 + -1;
        } while ((int)lVar11 != 0);
      }
      iVar13 = iVar12;
      bVar5 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar5);
    if (0 < iVar6) {
      lVar11 = 0;
      do {
        pvVar4 = __ptr->pArray[lVar11];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
          }
          free(pvVar4);
          uVar9 = (ulong)(uint)__ptr->nSize;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)uVar9);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar8;
}

Assistant:

Vec_Int_t * Aig_ManPartitionLevelized( Aig_Man_t * p, int nPartSize )
{
    Vec_Int_t * vId2Part;
    Vec_Vec_t * vNodes;
    Aig_Obj_t * pObj;
    int i, k, Counter = 0;
    vNodes = Aig_ManLevelize( p );
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    Vec_VecForEachEntryReverseReverse( Aig_Obj_t *, vNodes, pObj, i, k )
        Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    Vec_VecFree( vNodes );
    return vId2Part;
}